

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

void collectCustomModelNamesAndDescriptions
               (Model *model,
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *output)

{
  uint32 uVar1;
  Rep *pRVar2;
  StringVector *pSVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  Pipeline *pPVar4;
  CustomModel *pCVar5;
  long lVar6;
  void **ppvVar7;
  InternalMetadataWithArenaLite *pIVar8;
  long lVar9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  
  uVar1 = model->_oneof_case_[0];
  if ((int)uVar1 < 0xca) {
    if (uVar1 == 200) {
      pPVar4 = ((model->Type_).pipelineclassifier_)->pipeline_;
      if (pPVar4 == (Pipeline *)0x0) {
        pPVar4 = (Pipeline *)&CoreML::Specification::_Pipeline_default_instance_;
      }
      pRVar2 = (pPVar4->models_).super_RepeatedPtrFieldBase.rep_;
      ppvVar7 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar7 = (void **)0x0;
      }
      lVar9 = (long)(pPVar4->models_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar9 != 0) {
        lVar6 = 0;
        do {
          collectCustomModelNamesAndDescriptions(*(Model **)((long)ppvVar7 + lVar6),output);
          lVar6 = lVar6 + 8;
        } while (lVar9 * 8 != lVar6);
      }
    }
    else if (uVar1 == 0xc9) {
      pPVar4 = ((model->Type_).pipelineclassifier_)->pipeline_;
      if (pPVar4 == (Pipeline *)0x0) {
        pPVar4 = (Pipeline *)&CoreML::Specification::_Pipeline_default_instance_;
      }
      pRVar2 = (pPVar4->models_).super_RepeatedPtrFieldBase.rep_;
      ppvVar7 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar7 = (void **)0x0;
      }
      lVar9 = (long)(pPVar4->models_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar9 != 0) {
        lVar6 = 0;
        do {
          collectCustomModelNamesAndDescriptions(*(Model **)((long)ppvVar7 + lVar6),output);
          lVar6 = lVar6 + 8;
        } while (lVar9 * 8 != lVar6);
      }
    }
  }
  else if (uVar1 == 0x22b) {
    __a = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
           &(((model->Type_).pipeline_)->names_).super_RepeatedPtrFieldBase.current_size_;
    if (model->_oneof_case_[0] == 0x22b) {
      pCVar5 = (CustomModel *)(model->Type_).pipeline_;
    }
    else {
      pCVar5 = CoreML::Specification::CustomModel::default_instance();
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_60,__a,(pCVar5->description_).ptr_);
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)output,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.second._M_dataplus._M_p != &local_60.second.field_2) {
      operator_delete(local_60.second._M_dataplus._M_p,
                      local_60.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
      operator_delete(local_60.first._M_dataplus._M_p,
                      local_60.first.field_2._M_allocated_capacity + 1);
    }
  }
  else if (uVar1 == 0xca) {
    pSVar3 = (((model->Type_).treeensembleclassifier_)->ClassLabels_).stringclasslabels_;
    pIVar8 = &pSVar3->_internal_metadata_;
    if (pSVar3 == (StringVector *)0x0) {
      pIVar8 = (InternalMetadataWithArenaLite *)0x0;
    }
    lVar9 = (long)((model->Type_).treeensembleclassifier_)->postevaluationtransform_;
    if (lVar9 != 0) {
      lVar6 = 0;
      do {
        collectCustomModelNamesAndDescriptions
                  (*(Model **)
                    ((long)&(pIVar8->
                            super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                            ).ptr_ + lVar6),output);
        lVar6 = lVar6 + 8;
      } while (lVar9 * 8 != lVar6);
    }
  }
  return;
}

Assistant:

inline void collectCustomModelNamesAndDescriptions(const Specification::Model &model, std::vector<StringPair> *output) {

    switch (model.Type_case()) {
        case Specification::Model::kPipeline:
            for (auto &m : model.pipeline().models()) {
                collectCustomModelNamesAndDescriptions(m,output);
            }
            break;
        case Specification::Model::kPipelineRegressor:
            for (auto &m : model.pipelineregressor().pipeline().models()) {
                collectCustomModelNamesAndDescriptions(m,output);
            }
            break;
        case Specification::Model::kPipelineClassifier:
            for (auto &m : model.pipelineclassifier().pipeline().models()) {
                collectCustomModelNamesAndDescriptions(m,output);
            }
            break;
        case Specification::Model::kCustomModel:
            output->push_back(std::make_pair(model.custommodel().classname(),model.custommodel().description()));
            break;
        default:
            break;
    }
}